

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpace_STL.cpp
# Opt level: O2

Level * __thiscall amrex::EB2::IndexSpaceSTL::getLevel(IndexSpaceSTL *this,Geometry *geom)

{
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> _Var1
  ;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,__gnu_cxx::__ops::_Iter_equals_val<amrex::Box_const>>
                    ((this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish,&geom->domain);
  return (Level *)((this->m_stllevel).
                   super_vector<amrex::EB2::STLLevel,_std::allocator<amrex::EB2::STLLevel>_>.
                   super__Vector_base<amrex::EB2::STLLevel,_std::allocator<amrex::EB2::STLLevel>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                  (int)(((long)_Var1._M_current -
                        (long)(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x1c));
}

Assistant:

const Level&
IndexSpaceSTL::getLevel (const Geometry& geom) const
{
    auto it = std::find(std::begin(m_domain), std::end(m_domain), geom.Domain());
    int i = std::distance(m_domain.begin(), it);
    return m_stllevel[i];
}